

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuBackend.cpp
# Opt level: O0

bool __thiscall xmrig::CpuBackend::isEnabled(CpuBackend *this,Algorithm *algorithm)

{
  bool bVar1;
  Config *this_00;
  CpuConfig *this_01;
  long in_RDI;
  Threads<xmrig::CpuThreads> *in_stack_00000020;
  
  this_00 = Base::config((Base *)**(undefined8 **)(in_RDI + 8));
  this_01 = Config::cpu(this_00);
  CpuConfig::threads(this_01);
  Threads<xmrig::CpuThreads>::get(in_stack_00000020);
  bVar1 = CpuThreads::isEmpty((CpuThreads *)0x1fe6ff);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool xmrig::CpuBackend::isEnabled(const Algorithm &algorithm) const
{
    return !d_ptr->controller->config()->cpu().threads().get().isEmpty();
}